

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::ExactCompareEdgeDirections(Vector3_xf *a0,Vector3_xf *a1,Vector3_xf *b0,Vector3_xf *b1)

{
  bool bVar1;
  long lVar2;
  int local_c0;
  uint local_bc;
  BIGNUM *local_b8;
  Vector3<ExactFloat> local_b0;
  Vector3<ExactFloat> local_80;
  S2LogMessage local_50;
  S2LogMessage local_40;
  
  bVar1 = ArePointsAntipodal(a0,a1);
  if (bVar1) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x316,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: !ArePointsAntipodal(a0, a1) ",0x2a);
    if (bVar1) goto LAB_0021947f;
  }
  bVar1 = ArePointsAntipodal(b0,b1);
  if (bVar1) {
    S2LogMessage::S2LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x317,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_50.stream_,"Check failed: !ArePointsAntipodal(b0, b1) ",0x2a);
    if (bVar1) {
LAB_0021947f:
      abort();
    }
  }
  Vector3<ExactFloat>::CrossProd(&local_80,a0,a1);
  Vector3<ExactFloat>::CrossProd(&local_b0,b0,b1);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_c0,&local_80);
  BN_free(local_b8);
  lVar2 = 0x30;
  do {
    BN_free(*(BIGNUM **)((long)local_b0.c_ + lVar2 + -8));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  lVar2 = 0x30;
  do {
    BN_free(*(BIGNUM **)((long)&local_b0.c_[2].bn_.bn_ + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  if ((local_bc & 0xfffffffd) == 0x7ffffffd) {
    local_c0 = 0;
  }
  return local_c0;
}

Assistant:

int ExactCompareEdgeDirections(const Vector3_xf& a0, const Vector3_xf& a1,
                               const Vector3_xf& b0, const Vector3_xf& b1) {
  S2_DCHECK(!ArePointsAntipodal(a0, a1));
  S2_DCHECK(!ArePointsAntipodal(b0, b1));
  return a0.CrossProd(a1).DotProd(b0.CrossProd(b1)).sgn();
}